

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::resize_bilinear(Mat *src,Mat *dst,int w,int h,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  
  pLVar1 = create_layer(0x32);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,2);
  ParamDict::set(&pd,3,h);
  ParamDict::set(&pd,4,w);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void resize_bilinear(const Mat& src, Mat& dst, int w, int h, const Option& opt)
{
    ncnn::Layer* interp = ncnn::create_layer(ncnn::LayerType::Interp);

    ncnn::ParamDict pd;
    pd.set(0, 2);
    pd.set(3, h);
    pd.set(4, w);

    interp->load_param(pd);

    interp->forward(src, dst, opt);

    delete interp;
}